

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O2

bool __thiscall
QArrayDataPointer<QLayoutStruct>::tryReadjustFreeSpace
          (QArrayDataPointer<QLayoutStruct> *this,GrowthPosition pos,qsizetype n,
          QLayoutStruct **data)

{
  qsizetype qVar1;
  qsizetype qVar2;
  long lVar3;
  long lVar4;
  qsizetype qVar5;
  
  if (this->d == (Data *)0x0) {
    qVar5 = 0;
  }
  else {
    qVar5 = (this->d->super_QArrayData).alloc;
  }
  qVar1 = freeSpaceAtBegin(this);
  qVar2 = freeSpaceAtEnd(this);
  if (qVar1 < n || pos != GrowsAtEnd) {
    if (pos != GrowsAtBeginning) {
      return false;
    }
    if (qVar2 < n) {
      return false;
    }
    if (qVar5 <= this->size * 3) {
      return false;
    }
    lVar3 = (qVar5 - (this->size + n)) / 2;
    lVar4 = 0;
    if (0 < lVar3) {
      lVar4 = lVar3;
    }
    lVar4 = lVar4 + n;
  }
  else {
    lVar3 = this->size * 3;
    lVar4 = 0;
    if (SBORROW8(lVar3,qVar5 * 2) == lVar3 + qVar5 * -2 < 0) {
      return false;
    }
  }
  relocate(this,lVar4 - qVar1,data);
  return true;
}

Assistant:

bool tryReadjustFreeSpace(QArrayData::GrowthPosition pos, qsizetype n, const T **data = nullptr)
    {
        Q_ASSERT(!this->needsDetach());
        Q_ASSERT(n > 0);
        Q_ASSERT((pos == QArrayData::GrowsAtEnd && this->freeSpaceAtEnd() < n)
                 || (pos == QArrayData::GrowsAtBeginning && this->freeSpaceAtBegin() < n));

        const qsizetype capacity = this->constAllocatedCapacity();
        const qsizetype freeAtBegin = this->freeSpaceAtBegin();
        const qsizetype freeAtEnd = this->freeSpaceAtEnd();

        qsizetype dataStartOffset = 0;
        // algorithm:
        //   a. GrowsAtEnd: relocate if space at begin AND size < (capacity * 2) / 3
        //      [all goes to free space at end]:
        //      new free space at begin = 0
        //
        //   b. GrowsAtBeginning: relocate if space at end AND size < capacity / 3
        //      [balance the free space]:
        //      new free space at begin = n + (total free space - n) / 2
        if (pos == QArrayData::GrowsAtEnd && freeAtBegin >= n
            && ((3 * this->size) < (2 * capacity))) {
            // dataStartOffset = 0; - done in declaration
        } else if (pos == QArrayData::GrowsAtBeginning && freeAtEnd >= n
                   && ((3 * this->size) < capacity)) {
            // total free space == capacity - size
            dataStartOffset = n + qMax(0, (capacity - this->size - n) / 2);
        } else {
            // nothing to do otherwise
            return false;
        }

        relocate(dataStartOffset - freeAtBegin, data);

        Q_ASSERT((pos == QArrayData::GrowsAtEnd && this->freeSpaceAtEnd() >= n)
                 || (pos == QArrayData::GrowsAtBeginning && this->freeSpaceAtBegin() >= n));
        return true;
    }